

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor *
ggml_rope_multi(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,ggml_tensor *c,int n_dims,
               int *sections,int mode,int n_ctx_orig,float freq_base,float freq_scale,
               float ext_factor,float attn_factor,float beta_fast,float beta_slow)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ggml_tensor *pgVar3;
  char *pcVar4;
  int line;
  char *file;
  
  if ((mode & 1U) == 0) {
    if (((b->ne[1] == 1) && (b->ne[2] == 1)) && (b->ne[3] == 1)) {
      if (b->type == GGML_TYPE_I32) {
        if (a->ne[2] << 2 == b->ne[0]) {
          if (c != (ggml_tensor *)0x0) {
            if (c->type != GGML_TYPE_F32) {
              file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c"
              ;
              pcVar4 = "c->type == GGML_TYPE_F32";
              line = 0xe29;
              goto LAB_0011ce37;
            }
            if (c->ne[0] < (long)(n_dims / 2)) {
              file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c"
              ;
              pcVar4 = "c->ne[0] >= n_dims / 2";
              line = 0xe2a;
              goto LAB_0011ce37;
            }
          }
          pgVar3 = ggml_new_tensor_impl(ctx,a->type,4,a->ne,(ggml_tensor *)0x0,0);
          uVar1 = *(undefined8 *)sections;
          uVar2 = *(undefined8 *)(sections + 2);
          if (pgVar3 != (ggml_tensor *)0x0) {
            pgVar3->op_params[0] = 0;
            pgVar3->op_params[1] = n_dims;
            pgVar3->op_params[2] = mode;
            pgVar3->op_params[3] = 0;
            pgVar3->op_params[4] = n_ctx_orig;
            pgVar3->op_params[5] = (int32_t)freq_base;
            pgVar3->op_params[6] = (int32_t)freq_scale;
            pgVar3->op_params[7] = (int32_t)ext_factor;
            pgVar3->op_params[8] = (int32_t)attn_factor;
            pgVar3->op_params[9] = (int32_t)beta_fast;
            pgVar3->op_params[10] = (int32_t)beta_slow;
            *(undefined8 *)(pgVar3->op_params + 0xb) = uVar1;
            *(undefined8 *)(pgVar3->op_params + 0xd) = uVar2;
            pgVar3->op = GGML_OP_ROPE;
            pgVar3->src[0] = a;
            pgVar3->src[1] = b;
            pgVar3->src[2] = c;
            return pgVar3;
          }
          file = 
          "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-impl.h";
          pcVar4 = "tensor != NULL";
          line = 0x70;
        }
        else {
          file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
          pcVar4 = "a->ne[2] * 4 == b->ne[0]";
          line = 0xe26;
        }
      }
      else {
        file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
        pcVar4 = "b->type == GGML_TYPE_I32";
        line = 0xe25;
      }
    }
    else {
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
      pcVar4 = "ggml_is_vector(b)";
      line = 0xe24;
    }
  }
  else {
    file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
    pcVar4 = "(mode & 1) == 0 && \"mode & 1 == 1 is no longer supported\"";
    line = 0xe22;
  }
LAB_0011ce37:
  ggml_abort(file,line,"GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

struct ggml_tensor * ggml_rope_multi(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        struct ggml_tensor  * c,
        int                   n_dims,
        int                   sections[4],
        int                   mode,
        int                   n_ctx_orig,
        float                 freq_base,
        float                 freq_scale,
        float                 ext_factor,
        float                 attn_factor,
        float                 beta_fast,
        float                 beta_slow) {
    // Multimodal Rotary Position Embedding
    GGML_ASSERT((mode & 1) == 0 && "mode & 1 == 1 is no longer supported");

    GGML_ASSERT(ggml_is_vector(b));
    GGML_ASSERT(b->type == GGML_TYPE_I32);
    GGML_ASSERT(a->ne[2] * 4 == b->ne[0]); // mrope expecting 4 position ids per token

    if (c) {
        GGML_ASSERT(c->type == GGML_TYPE_F32);
        GGML_ASSERT(c->ne[0] >= n_dims / 2);
    }

    struct ggml_tensor * result = ggml_dup_tensor(ctx, a);

    int32_t params[11 + 4] = { /*n_past*/ 0, n_dims, mode, /*n_ctx*/ 0, n_ctx_orig };
    memcpy(params +  5, &freq_base,    sizeof(float));
    memcpy(params +  6, &freq_scale,   sizeof(float));
    memcpy(params +  7, &ext_factor,   sizeof(float));
    memcpy(params +  8, &attn_factor,  sizeof(float));
    memcpy(params +  9, &beta_fast,    sizeof(float));
    memcpy(params + 10, &beta_slow,    sizeof(float));
    memcpy(&params[11], sections,      sizeof(int)*4);
    ggml_set_op_params(result, params, sizeof(params));

    result->op   = GGML_OP_ROPE;
    result->src[0] = a;
    result->src[1] = b;
    result->src[2] = c;

    return result;
}